

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O0

Vec3 __thiscall
anon_unknown.dwarf_45a12::MapDriver::steerToFollowPathLinear
          (MapDriver *this,int direction,float predictionTime,GCRoute *path)

{
  size_type sVar1;
  PolylineSegmentedPathwaySegmentRadii *in_RDX;
  int in_ESI;
  long *in_RDI;
  float in_XMM0_Da;
  float maxLength;
  float fVar2;
  float extraout_XMM0_Da;
  Vec3 *extraout_XMM0_Qa;
  Vec3 *extraout_XMM0_Qb;
  Vec3 VVar3;
  Vec3 seek;
  float newTargetPathDistance;
  Vec3 itTangent;
  Vec3 ipTangent;
  int it;
  int ip;
  Vec3 target;
  float targetPathDistance;
  bool whollyInside;
  float m;
  Vec3 nowOnPath;
  float nowOutside;
  Vec3 onPath;
  float futureOutside;
  bool correctDirection;
  Vec3 pathHeading;
  float nowPathDistance;
  Vec3 futurePosition;
  float pathDistanceOffset;
  undefined8 in_stack_fffffffffffffcb8;
  Vec3 *v;
  Vec3 *in_stack_fffffffffffffcc0;
  Vec3 *this_00;
  undefined4 in_stack_fffffffffffffcc8;
  float fVar4;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffcd8;
  PolylineSegmentedPathwaySegmentRadii *pathway;
  PolylineSegmentedPathwaySegmentRadii *point;
  PolylineSegmentedPathwaySegmentRadii *in_stack_fffffffffffffcf0;
  PolylineSegmentedPathwaySegmentRadii *pathway_00;
  bool local_2f9;
  Vec3 local_2e8 [2];
  Vec3 *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  Vec3 local_258 [4];
  Vec3 local_220 [5];
  Vec3 local_1e0;
  float local_1d4;
  float local_1c8;
  Vec3 local_1bc;
  float local_1b0;
  undefined4 uStack_1ac;
  Vec3 local_1a0;
  int local_194;
  undefined8 local_190;
  undefined8 local_180;
  int local_174;
  Vec3 local_160;
  float local_154;
  bool local_14d;
  float local_14c;
  Vec3 local_148;
  undefined8 local_138;
  float local_130;
  undefined8 local_128;
  float local_120;
  undefined8 local_118;
  float local_110;
  float local_10c;
  Vec3 local_108;
  undefined8 local_f8;
  float local_f0;
  float local_ec;
  Vec3 local_e8;
  Vec3 local_d8;
  byte local_c9;
  Vec3 local_c8;
  Vec3 local_b8;
  undefined8 local_a8;
  float local_a0;
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  float local_80;
  Vec3 local_78;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  float local_4c;
  undefined8 local_48;
  float local_40;
  undefined8 local_38;
  float local_30;
  float local_2c;
  PolylineSegmentedPathwaySegmentRadii *local_28;
  int local_1c;
  Vec3 local_c;
  
  fVar4 = (float)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
  maxLength = (float)in_ESI * in_XMM0_Da;
  local_28 = in_RDX;
  local_1c = in_ESI;
  fVar2 = (float)(**(code **)(*in_RDI + 0xd8))();
  local_2c = maxLength * fVar2;
  local_48 = (**(code **)(*in_RDI + 0xe8))();
  pathway = local_28;
  local_40 = fVar2;
  local_38 = local_48;
  local_30 = fVar2;
  local_68 = (**(code **)(*in_RDI + 0x40))();
  local_60 = fVar2;
  local_58 = local_68;
  local_50 = fVar2;
  (*(pathway->super_SegmentedPathway).super_Pathway._vptr_Pathway[5])(pathway,&local_58);
  point = local_28;
  local_4c = extraout_XMM0_Da;
  local_a8 = (**(code **)(*in_RDI + 0x40))();
  local_a0 = fVar2;
  local_98 = local_a8;
  local_90 = fVar2;
  VVar3 = mapPointToTangent(pathway,(Vec3 *)CONCAT44(maxLength,in_stack_fffffffffffffcd8));
  local_b8.z = VVar3.z;
  local_80 = local_b8.z;
  local_b8._0_8_ = VVar3._0_8_;
  local_88._0_4_ = local_b8.x;
  local_88._4_4_ = local_b8.y;
  local_b8 = VVar3;
  VVar3 = OpenSteer::Vec3::operator*(in_stack_fffffffffffffcc0,fVar4);
  fVar2 = VVar3.z;
  local_c8._0_8_ = VVar3._0_8_;
  local_78.x = local_c8.x;
  local_78.y = local_c8.y;
  local_c8 = VVar3;
  local_78.z = fVar2;
  local_e8._0_8_ = (**(code **)(*in_RDI + 0x30))();
  local_e8.z = fVar2;
  local_d8._0_8_ = local_e8._0_8_;
  local_d8.z = fVar2;
  fVar2 = OpenSteer::Vec3::dot(&local_78,&local_d8);
  local_c9 = 0.0 < fVar2;
  VVar3 = mapPointToPointOnCenterLineAndOutside
                    (in_stack_fffffffffffffcf0,(Vec3 *)point,(float *)pathway);
  fVar2 = VVar3.z;
  local_108._0_8_ = VVar3._0_8_;
  local_f8._0_4_ = local_108.x;
  local_f8._4_4_ = local_108.y;
  pathway_00 = local_28;
  local_108 = VVar3;
  local_f0 = fVar2;
  local_138 = (**(code **)(*in_RDI + 0x40))();
  local_130 = fVar2;
  local_128 = local_138;
  local_120 = fVar2;
  VVar3 = mapPointToPointOnCenterLineAndOutside(pathway_00,(Vec3 *)point,(float *)pathway);
  local_148._0_8_ = VVar3._0_8_;
  local_118._0_4_ = local_148.x;
  local_118._4_4_ = local_148.y;
  local_148.z = VVar3.z;
  local_110 = local_148.z;
  local_148 = VVar3;
  local_14c = (float)(**(code **)(*in_RDI + 0xc0))();
  local_14c = -local_14c;
  local_2f9 = local_ec < local_14c && local_10c < local_14c;
  local_14d = local_2f9;
  if ((local_ec < local_14c && local_10c < local_14c) && ((local_c9 & 1) != 0)) {
    local_c.x = OpenSteer::Vec3::zero.x;
    local_c.y = OpenSteer::Vec3::zero.y;
    local_c.z = OpenSteer::Vec3::zero.z;
  }
  else {
    uVar5 = 0x3dcccccd;
    fVar2 = 1.0;
    if ((local_c9 & 1) == 0) {
      fVar2 = 0.1;
    }
    local_154 = local_2c * fVar2 + local_4c;
    fVar2 = local_4c;
    fVar4 = local_2c;
    (*(local_28->super_SegmentedPathway).super_Pathway._vptr_Pathway[4])();
    local_190 = (**(code **)(*in_RDI + 0x40))();
    local_180 = local_190;
    sVar1 = mapPointToSegmentIndex
                      ((PolylineSegmentedPathwaySegmentRadii *)CONCAT44(uVar5,fVar4),
                       (Vec3 *)CONCAT44(fVar2,in_stack_fffffffffffffcc8));
    local_174 = (int)sVar1;
    sVar1 = mapPointToSegmentIndex
                      ((PolylineSegmentedPathwaySegmentRadii *)CONCAT44(uVar5,fVar4),
                       (Vec3 *)CONCAT44(fVar2,in_stack_fffffffffffffcc8));
    local_194 = (int)sVar1;
    (*(local_28->super_SegmentedPathway).super_Pathway._vptr_Pathway[0x11])
              (local_28,(long)local_174);
    fVar2 = SUB84(extraout_XMM0_Qa,0);
    uStack_1ac = (undefined4)((ulong)extraout_XMM0_Qa >> 0x20);
    v = extraout_XMM0_Qa;
    this_00 = extraout_XMM0_Qb;
    local_1b0 = fVar2;
    (*(local_28->super_SegmentedPathway).super_Pathway._vptr_Pathway[0x11])
              (local_28,(long)local_194);
    local_1c8 = fVar2;
    local_1bc.z = fVar2;
    if ((local_174 + local_1c == local_194) &&
       (fVar2 = OpenSteer::Vec3::dot(&local_1bc,&local_1a0), fVar2 < -0.1)) {
      local_1d4 = local_2c + local_2c + local_4c;
      (*(local_28->super_SegmentedPathway).super_Pathway._vptr_Pathway[4])();
      OpenSteer::Vec3::operator=(&local_160,&local_1e0);
    }
    (**(code **)(*in_RDI + 0x120))(in_RDI,&local_38,&local_f8,&local_160);
    if (local_10c <= 0.0) {
      OpenSteer::
      SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
      ::steerForSeek((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                     in_stack_fffffffffffffd38);
      (**(code **)(*in_RDI + 0xf0))();
      VVar3 = OpenSteer::Vec3::truncateLength((Vec3 *)pathway,maxLength);
      local_258[0]._0_8_ = VVar3._0_8_;
      local_258[0].z = VVar3.z;
      if ((0.0 <= local_10c) || (local_ec <= 0.0)) {
        local_c.x = local_258[0].x;
        local_c.y = local_258[0].y;
        local_c.z = local_258[0].z;
      }
      else {
        (**(code **)(*in_RDI + 0x30))();
        OpenSteer::Vec3::perpendicularComponent((Vec3 *)pathway_00,(Vec3 *)point);
        (**(code **)(*in_RDI + 0x30))();
        (**(code **)(*in_RDI + 0xf0))();
        OpenSteer::Vec3::operator*(this_00,(float)((ulong)v >> 0x20));
        VVar3 = OpenSteer::Vec3::operator-(this_00,v);
        local_2e8[0]._0_8_ = VVar3._0_8_;
        local_c.x = local_2e8[0].x;
        local_c.y = local_2e8[0].y;
        local_2e8[0].z = VVar3.z;
        local_c.z = local_2e8[0].z;
      }
    }
    else {
      VVar3 = OpenSteer::
              SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
              ::steerForSeek((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                              *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                             in_stack_fffffffffffffd38);
      local_220[0]._0_8_ = VVar3._0_8_;
      local_c.x = local_220[0].x;
      local_c.y = local_220[0].y;
      local_220[0].z = VVar3.z;
      local_c.z = local_220[0].z;
    }
  }
  VVar3.z = local_c.z;
  VVar3.x = local_c.x;
  VVar3.y = local_c.y;
  return VVar3;
}

Assistant:

Vec3 steerToFollowPathLinear (const int direction,
                                      const float predictionTime,
                                      GCRoute& path)
        {
            // our goal will be offset from our path distance by this amount
            const float pathDistanceOffset = direction * predictionTime * speed();

            // predict our future position
            const Vec3 futurePosition = predictFuturePosition (predictionTime);

            // measure distance along path of our current and predicted positions
            const float nowPathDistance =
                path.mapPointToPathDistance (position ());

            // are we facing in the correction direction?
            const Vec3 pathHeading = mapPointToTangent( path, position() ) * static_cast< float >( direction );// path.tangentAt(position()) * (float)direction;
            const bool correctDirection = pathHeading.dot (forward ()) > 0;

            // find the point on the path nearest the predicted future position
            // XXX need to improve calling sequence, maybe change to return a
            // XXX special path-defined object which includes two Vec3s and a 
            // XXX bool (onPath,tangent (ignored), withinPath)
            float futureOutside;
            const Vec3 onPath = mapPointToPointOnCenterLineAndOutside( path, futurePosition, futureOutside ); // path.mapPointToPath (futurePosition,futureOutside);

            // determine if we are currently inside the path tube
            float nowOutside;
            const Vec3 nowOnPath = mapPointToPointOnCenterLineAndOutside( path, position(), nowOutside );  // path.mapPointToPath (position (), nowOutside);

            // no steering is required if our present and future positions are
            // inside the path tube and we are facing in the correct direction
            const float m = -radius ();
            const bool whollyInside = (futureOutside < m) && (nowOutside < m);
            if (whollyInside && correctDirection)
            {
                // all is well, return zero steering
                return Vec3::zero;
            }
            else
            {
                // otherwise we need to steer towards a target point obtained
                // by adding pathDistanceOffset to our current path position
                // (reduce the offset if facing in the wrong direction)
                const float targetPathDistance = (nowPathDistance + 
                                                  (pathDistanceOffset *
                                                   (correctDirection ? 1 : 0.1f)));
                Vec3 target = path.mapPathDistanceToPoint (targetPathDistance);


                // if we are on one segment and target is on the next segment and
                // the dot of the tangents of the two segments is negative --
                // increase the target offset to compensate the fold back
                const int ip =  static_cast< int >( mapPointToSegmentIndex( path, position() ) ); // path.indexOfNearestSegment (position ());
                const int it =  static_cast< int >( mapPointToSegmentIndex( path, target ) ); // path.indexOfNearestSegment (target);
                // Because polyline paths have a constant tangent along a segment
                // just set the distance along the segment to @c 0.0f.
                Vec3 const ipTangent = path.mapSegmentDistanceToTangent( ip, 0.0f );
                // Because polyline paths have a constant tangent along a segment
                // just set the distance along the segment to @c 0.0f.
                Vec3 const itTangent = path.mapSegmentDistanceToTangent( it, 0.0f );
                if (((ip + direction) == it) &&
                    ( /* path.dotSegmentUnitTangents (it, ip) */  itTangent.dot( ipTangent ) < -0.1f ) )
                {
                    const float newTargetPathDistance =
                        nowPathDistance + (pathDistanceOffset * 2);
                    target = path.mapPathDistanceToPoint (newTargetPathDistance);
                }

                annotatePathFollowing (futurePosition,onPath,target,futureOutside);

                // if we are currently outside head directly in
                // (QQQ new, experimental, makes it turn in more sharply)
                if (nowOutside > 0) return steerForSeek (nowOnPath);

                // steering to seek target on path
                const Vec3 seek = steerForSeek (target).truncateLength(maxForce());

                // return that seek steering -- except when we are heading off
                // the path (currently on path and future position is off path)
                // in which case we put on the brakes.
                if ((nowOutside < 0) && (futureOutside > 0))
                    return (seek.perpendicularComponent (forward ()) -
                            (forward () * maxForce ()));
                else
                    return seek;
            }
        }